

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O2

ByteData160 * cfd::core::HashUtil::Hash160(ByteData160 *__return_storage_ptr__,string *str)

{
  CfdException *this;
  allocator local_5d;
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> output;
  undefined1 local_40 [32];
  
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&output,0x14,(allocator_type *)local_40);
  ret = wally_hash160((uchar *)(str->_M_dataplus)._M_p,str->_M_string_length,
                      output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                            ._M_impl.super__Vector_impl_data._M_start);
  if (ret == 0) {
    ByteData160::ByteData160(__return_storage_ptr__,&output);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&output.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return __return_storage_ptr__;
  }
  local_40._0_8_ = "cfdcore_util.cpp";
  local_40._8_4_ = 0xda;
  local_40._16_8_ = "Hash160";
  logger::warn<int&>((CfdSourceLocation *)local_40,"wally_hash160 NG[{}].",&ret);
  this = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)local_40,"hash160 calc error.",&local_5d);
  CfdException::CfdException(this,kCfdIllegalStateError,(string *)local_40);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData160 HashUtil::Hash160(const std::string &str) {
  std::vector<uint8_t> output(HASH160_LEN);

  // Hash160
  int ret = wally_hash160(
      reinterpret_cast<const uint8_t *>(str.data()), str.size(), output.data(),
      output.size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_hash160 NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "hash160 calc error.");
  }

  ByteData160 byte160(output);
  return byte160;
}